

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::node::announce
          (node *this,sha1_hash *info_hash,int listen_port,announce_flags_t flags,
          function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
          *f)

{
  dht_observer *pdVar1;
  _Manager_type p_Var2;
  int iVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  announce_flags_t flags_00;
  ulong uVar5;
  span<const_char> in;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type local_90;
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_80;
  _Bind<void_(*(std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_libtorrent::dht::node_&,_int,_const_libtorrent::digest32<160L>_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>)>
  local_60;
  
  uVar4 = CONCAT71(in_register_00000009,flags.m_val);
  uVar5 = uVar4 & 0xffffffff;
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    iVar3 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar3 != '\0') {
      pdVar1 = this->m_observer;
      in.m_len = uVar4;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)&local_60,(aux *)info_hash,in);
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"announcing [ ih: %s p: %d ]",local_60._M_f,(ulong)(uint)listen_port);
      ::std::__cxx11::string::~string((string *)&local_60);
    }
  }
  if (listen_port == 0) {
    pdVar1 = this->m_observer;
    if (pdVar1 == (dht_observer *)0x0) {
      listen_port = 0;
    }
    else {
      listen_port = (*(pdVar1->super_dht_logger)._vptr_dht_logger[4])
                              (pdVar1,(ulong)((byte)(uVar5 >> 2) & 1),&this->m_sock);
    }
  }
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (_Manager_type)0x0;
  local_90 = f->_M_invoker;
  p_Var2 = (f->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_a8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(f->super__Function_base)._M_functor;
    local_a8._8_8_ = *(undefined8 *)((long)&(f->super__Function_base)._M_functor + 8);
    (f->super__Function_base)._M_manager = (_Manager_type)0x0;
    f->_M_invoker = (_Invoker_type)0x0;
    local_98 = p_Var2;
  }
  local_60._M_f = anon_unknown_0::announce_fun;
  flags_00.m_val = (uchar)uVar5;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<2UL,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<3UL,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .super__Head_base<3UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems._0_8_ =
       *(undefined8 *)(info_hash->m_number)._M_elems;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<2UL,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<3UL,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .super__Head_base<3UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems._8_8_ =
       *(undefined8 *)((info_hash->m_number)._M_elems + 2);
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<2UL,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<3UL,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .super__Head_base<3UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[4] =
       (info_hash->m_number)._M_elems[4];
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<2UL,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<3UL,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<4UL,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Head_base<4UL,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>,_false>
  ._M_head_impl.m_val =
       (_Head_base<4UL,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>,_false>
        )(_Head_base<4UL,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>,_false>
          )flags_00.m_val;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<2UL,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .super__Head_base<2UL,_int,_false>._M_head_impl = listen_port;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>_>
  .super__Head_base<1UL,_std::reference_wrapper<libtorrent::dht::node>,_false>._M_head_impl._M_data
       = (reference_wrapper<libtorrent::dht::node>)(reference_wrapper<libtorrent::dht::node>)this;
  ::std::
  function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>
  ::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::reference_wrapper<libtorrent::dht::node>,int,libtorrent::digest32<160l>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::dht_announce_flag_tag,void>))(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,libtorrent::dht::node&,int,libtorrent::digest32<160l>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::dht_announce_flag_tag,void>)>,void>
            ((function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>
              *)&local_80,&local_60);
  get_peers(this,info_hash,
            (function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
             *)&local_a8,&local_80,flags_00);
  ::std::_Function_base::~_Function_base(&local_80.super__Function_base);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  return;
}

Assistant:

void node::announce(sha1_hash const& info_hash, int listen_port, announce_flags_t const flags
	, std::function<void(std::vector<tcp::endpoint> const&)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		m_observer->log(dht_logger::node, "announcing [ ih: %s p: %d ]"
			, aux::to_hex(info_hash).c_str(), listen_port);
	}
#endif

	if (listen_port == 0 && m_observer != nullptr)
	{
		listen_port = m_observer->get_listen_port(
			(flags & announce::ssl_torrent) ? aux::transport::ssl : aux::transport::plaintext
			, m_sock);
	}

	get_peers(info_hash, std::move(f)
		, std::bind(&announce_fun, _1, std::ref(*this)
		, listen_port, info_hash, flags), flags);
}